

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall DACSThinker::DACSThinker(DACSThinker *this)

{
  DACSThinker *pDVar1;
  DACSThinker *this_local;
  
  DThinker::DThinker(&this->super_DThinker,0x67);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00b6c610;
  TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::TMap
            (&this->RunningScripts);
  pDVar1 = ::TObjPtr::operator_cast_to_DACSThinker_((TObjPtr *)&ActiveThinker);
  if (pDVar1 == (DACSThinker *)0x0) {
    TObjPtr<DACSThinker>::operator=(&ActiveThinker,this);
    this->Scripts = (DLevelScript *)0x0;
    this->LastScript = (DLevelScript *)0x0;
    TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::Clear
              (&this->RunningScripts,1);
  }
  else {
    I_Error("Only one ACSThinker is allowed to exist at a time.\nCheck your code.");
  }
  return;
}

Assistant:

DACSThinker::DACSThinker ()
: DThinker(STAT_SCRIPTS)
{
	if (ActiveThinker)
	{
		I_Error ("Only one ACSThinker is allowed to exist at a time.\nCheck your code.");
	}
	else
	{
		ActiveThinker = this;
		Scripts = NULL;
		LastScript = NULL;
		RunningScripts.Clear();
	}
}